

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getRhos(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_90;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_90);
  return (RealType)local_90;
}

Assistant:

RealType EAMAdapter::getRhos() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.rhos;
  }